

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_dump(lua_State *L)

{
  uint64_t uVar1;
  int iVar2;
  GCfunc *pGVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  uint strip;
  
  pGVar3 = lj_lib_checkfunc(L,1);
  pTVar5 = L->base + 1;
  strip = 0;
  if (pTVar5 < L->top) {
    strip = (uint)(*(short *)((long)L->base + 0xe) != -1);
  }
  uVar1 = (L->glref).ptr64;
  *(lua_State **)(uVar1 + 0xe0) = L;
  *(undefined8 *)(uVar1 + 200) = *(undefined8 *)(uVar1 + 0xd8);
  L->top = pTVar5;
  if ((pGVar3->c).ffid == '\0') {
    iVar2 = lj_bcwrite(L,(GCproto *)((pGVar3->c).pc.ptr64 - 0x68),writer_buf,(void *)(uVar1 + 200),
                       strip);
    if (iVar2 == 0) {
      pTVar5 = L->top;
      pGVar4 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                          (ulong)(uint)(*(int *)(uVar1 + 200) - (int)*(char **)(uVar1 + 0xd8)));
      pTVar5[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
      uVar1 = (L->glref).ptr64;
      if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
        lj_gc_step(L);
      }
      return 1;
    }
  }
  lj_err_caller(L,LJ_ERR_STRDUMP);
}

Assistant:

LJLIB_CF(string_dump)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int strip = L->base+1 < L->top && tvistruecond(L->base+1);
  SBuf *sb = lj_buf_tmp_(L);  /* Assumes lj_bcwrite() doesn't use tmpbuf. */
  L->top = L->base+1;
  if (!isluafunc(fn) || lj_bcwrite(L, funcproto(fn), writer_buf, sb, strip))
    lj_err_caller(L, LJ_ERR_STRDUMP);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}